

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Output::preflightFlowElement(Output *this,uint param_1,void **param_2)

{
  StringRef local_68;
  StringRef local_58;
  int local_44;
  undefined1 auStack_40 [4];
  int i;
  StringRef local_30;
  void **local_20;
  void **param_2_local;
  Output *pOStack_10;
  uint param_1_local;
  Output *this_local;
  
  local_20 = param_2;
  param_2_local._4_4_ = param_1;
  pOStack_10 = this;
  if ((this->NeedFlowSequenceComma & 1U) != 0) {
    StringRef::StringRef(&local_30,", ");
    output(this,local_30);
  }
  if ((this->WrapColumn != 0) && (this->WrapColumn < this->Column)) {
    StringRef::StringRef((StringRef *)auStack_40,"\n");
    output(this,_auStack_40);
    for (local_44 = 0; local_44 < this->ColumnAtFlowStart; local_44 = local_44 + 1) {
      StringRef::StringRef(&local_58," ");
      output(this,local_58);
    }
    this->Column = this->ColumnAtFlowStart;
    StringRef::StringRef(&local_68,"  ");
    output(this,local_68);
  }
  return true;
}

Assistant:

bool Output::preflightFlowElement(unsigned, void *&) {
  if (NeedFlowSequenceComma)
    output(", ");
  if (WrapColumn && Column > WrapColumn) {
    output("\n");
    for (int i = 0; i < ColumnAtFlowStart; ++i)
      output(" ");
    Column = ColumnAtFlowStart;
    output("  ");
  }
  return true;
}